

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall
Memory::Recycler::ExplicitFreeInternal<(Memory::ObjectInfoBits)0,MediumAllocationBlockAttributes>
          (Recycler *this,void *buffer,size_t size,size_t sizeCat)

{
  code *pcVar1;
  bool bVar2;
  ObjectInfoBits OVar3;
  BOOL BVar4;
  DWORD DVar5;
  DWORD DVar6;
  int iVar7;
  undefined4 *puVar8;
  HeapInfo *this_00;
  LargeHeapBlock *this_01;
  undefined4 extraout_var;
  size_t fillSize;
  byte expectedFill;
  LargeHeapBlock *largeHeapBlock;
  HeapBlock *heapBlock;
  HeapInfo *heapInfo;
  RecyclerHeapObjectInfo info;
  size_t sizeCat_local;
  size_t size_local;
  void *buffer_local;
  Recycler *this_local;
  
  info._32_8_ = sizeCat;
  BVar4 = IsSweeping(this);
  if ((BVar4 == 0) && (BVar4 = IsExiting(this), BVar4 == 0)) {
    BVar4 = IsConcurrentState(this);
    if (((BVar4 == 0) && (BVar4 = CollectionInProgress(this), BVar4 != 0)) &&
       (BVar4 = IsAllocatableCallbackState(this), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x4ab,
                         "(this->IsConcurrentState() || !this->CollectionInProgress() || this->IsAllocatableCallbackState())"
                         ,
                         "this->IsConcurrentState() || !this->CollectionInProgress() || this->IsAllocatableCallbackState()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    RecyclerHeapObjectInfo::RecyclerHeapObjectInfo((RecyclerHeapObjectInfo *)&heapInfo);
    bVar2 = FindHeapObject(this,buffer,FindHeapObjectFlags_NoFreeBitVerify,
                           (RecyclerHeapObjectInfo *)&heapInfo);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x4b1,
                         "(this->FindHeapObject(buffer, FindHeapObjectFlags_NoFreeBitVerify, info))"
                         ,"this->FindHeapObject(buffer, FindHeapObjectFlags_NoFreeBitVerify, info)")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    OVar3 = RecyclerHeapObjectInfo::GetAttributes((RecyclerHeapObjectInfo *)&heapInfo);
    if ((OVar3 & ~LeafBit) != NoBit) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x4b2,"((info.GetAttributes() & ~ObjectInfoBits::LeafBit) == 0)",
                         "(info.GetAttributes() & ~ObjectInfoBits::LeafBit) == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    this_00 = GetHeapInfo<(Memory::ObjectInfoBits)0>(this);
    if (this->mainThreadHandle != (HANDLE)0x0) {
      DVar5 = GetCurrentThreadId();
      DVar6 = GetThreadId(this->mainThreadHandle);
      if (DVar5 != DVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x4ba,
                           "(this->mainThreadHandle == 0 || ::GetCurrentThreadId() == ::GetThreadId(this->mainThreadHandle))"
                           ,
                           "this->mainThreadHandle == NULL || ::GetCurrentThreadId() == ::GetThreadId(this->mainThreadHandle)"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    this_01 = (LargeHeapBlock *)FindHeapBlock(this,buffer);
    if (this_01 == (LargeHeapBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x4be,"(heapBlock != nullptr)","heapBlock != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    iVar7 = (*(this_01->super_HeapBlock)._vptr_HeapBlock[5])();
    if (this_00 != (HeapInfo *)CONCAT44(extraout_var,iVar7)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x4c1,"(heapInfo == heapBlock->GetHeapInfo())",
                         "heapInfo == heapBlock->GetHeapInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    bVar2 = IsPageHeapEnabled(this);
    if (bVar2) {
      bVar2 = ShouldCapturePageHeapFreeStack(this);
      if (((bVar2) && (bVar2 = HeapBlock::IsLargeHeapBlock((HeapBlock *)this_01), bVar2)) &&
         (bVar2 = LargeHeapBlock::InPageHeapMode(this_01), bVar2)) {
        LargeHeapBlock::CapturePageHeapFreeStack(this_01);
      }
      this_local._7_1_ = false;
    }
    else {
      SetExplicitFreeBitOnSmallBlock<MediumAllocationBlockAttributes>
                (this,(HeapBlock *)this_01,info._32_8_,buffer,NoBit);
      HeapInfo::FreeMediumObject<(Memory::ObjectInfoBits)0>(this_00,buffer,info._32_8_);
      fillSize._7_1_ = 0;
      BVar4 = VerifyEnabled(this);
      if (BVar4 != 0) {
        fillSize._7_1_ = 0xca;
      }
      memset((void *)((long)buffer + 8),(uint)fillSize._7_1_,size - 8);
      if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
        SetTrackerData(this,buffer,&TrackerData::ExplicitFreeListObjectData);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Recycler::ExplicitFreeInternal(void* buffer, size_t size, size_t sizeCat)
{
    // If the GC is in sweep state while FreeInternal is called, we might be executing a finalizer
    // which called Free, which would cause a "sweepable" buffer to be free-listed. Don't allow this.
    // Also don't allow freeing while we're shutting down the recycler since finalizers get executed
    // at this stage too
    if (this->IsSweeping() || this->IsExiting())
    {
        return false;
    }

#if ENABLE_CONCURRENT_GC
    // We shouldn't be freeing object when we are running GC in thread
    Assert(this->IsConcurrentState() || !this->CollectionInProgress() || this->IsAllocatableCallbackState());
#else
    Assert(!this->CollectionInProgress() || this->IsAllocatableCallbackState());
#endif

    DebugOnly(RecyclerHeapObjectInfo info);
    Assert(this->FindHeapObject(buffer, FindHeapObjectFlags_NoFreeBitVerify, info));
    Assert((info.GetAttributes() & ~ObjectInfoBits::LeafBit) == 0);          // Only NoBit or LeafBit

    HeapInfo * heapInfo = this->GetHeapInfo<attributes>();
#if DBG || defined(RECYCLER_MEMORY_VERIFY) || defined(RECYCLER_PAGE_HEAP)

    // Either the mainThreadHandle is null (we're not thread bound)
    // or we should be calling this function on the main script thread
    Assert(this->mainThreadHandle == NULL ||
        ::GetCurrentThreadId() == ::GetThreadId(this->mainThreadHandle));

    HeapBlock* heapBlock = this->FindHeapBlock(buffer);

    Assert(heapBlock != nullptr);

#if DBG
    Assert(heapInfo == heapBlock->GetHeapInfo());
#endif

#ifdef RECYCLER_PAGE_HEAP
    if (this->IsPageHeapEnabled())
    {
#ifdef STACK_BACK_TRACE
        if (this->ShouldCapturePageHeapFreeStack())
        {
            if (heapBlock->IsLargeHeapBlock())
            {
                LargeHeapBlock* largeHeapBlock = (LargeHeapBlock*)heapBlock;
                if (largeHeapBlock->InPageHeapMode())
                {
                    largeHeapBlock->CapturePageHeapFreeStack();
                }
            }
        }
#endif

        // Don't do actual explicit free in page heap mode
        return false;
    }
#endif

    SetExplicitFreeBitOnSmallBlock<TBlockAttributes>(heapBlock, sizeCat, buffer, attributes);

#endif

    if (TBlockAttributes::IsMediumBlock)
    {
        heapInfo->FreeMediumObject<attributes>(buffer, sizeCat);
    }
    else
    {
        heapInfo->FreeSmallObject<attributes>(buffer, sizeCat);
    }

    if (size > sizeof(FreeObject) || TBlockAttributes::IsMediumBlock)
    {
        // Do this on the background somehow?
        byte expectedFill = 0;
        size_t fillSize = size - sizeof(FreeObject);

#ifdef RECYCLER_MEMORY_VERIFY
        if (this->VerifyEnabled())
        {
            expectedFill = Recycler::VerifyMemFill;
        }
#endif

        memset(((char*)buffer) + sizeof(FreeObject), expectedFill, fillSize);
    }

#ifdef PROFILE_RECYCLER_ALLOC
    if (this->trackerDictionary != nullptr)
    {
        this->SetTrackerData(buffer, &TrackerData::ExplicitFreeListObjectData);
    }
#endif

    return true;
}